

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapyRateTest.cpp
# Opt level: O0

int SoapySDRRateTest(string *argStr,double sampleRate,string *formatStr,string *channelStr,
                    string *directionStr)

{
  bool bVar1;
  int iVar2;
  Device *pDVar3;
  invalid_argument *this;
  ulong uVar4;
  reference pvVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar6;
  ostream *poVar7;
  size_type sVar8;
  string *in_RCX;
  Stream *in_RDX;
  string *in_RSI;
  string *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  exception *ex;
  Stream *stream;
  size_t elemSize;
  string format;
  double fullScale;
  unsigned_long *chan;
  iterator __end1_1;
  iterator __begin1_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  iterator __end1;
  iterator __begin1;
  Kwargs *__range1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channels;
  int direction;
  Device *device;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_140;
  ulong local_138;
  string local_130 [32];
  undefined8 local_110;
  reference local_108;
  unsigned_long *local_100;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_f0;
  undefined8 local_e8;
  long local_e0;
  reference local_d8;
  _Self local_d0;
  _Self local_c8;
  string local_c0 [48];
  string *local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  undefined1 local_69;
  string local_68 [32];
  int local_48;
  size_t in_stack_ffffffffffffffc0;
  Device *pDVar9;
  
  pDVar3 = (Device *)SoapySDR::Device::make(in_RDI);
  local_48 = -1;
  bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  if ((bVar1) ||
     (bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8), bVar1))
  {
    local_48 = 1;
  }
  bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  if ((bVar1) ||
     (bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8), bVar1))
  {
    local_48 = 0;
  }
  if (local_48 != -1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x113e1e);
    SoapySDR::KwargsFromString(local_c0);
    local_90 = local_c0;
    local_c8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin(in_stack_fffffffffffffda8);
    local_d0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(in_stack_fffffffffffffda8);
    while (bVar1 = std::operator!=(&local_c8,&local_d0), bVar1) {
      local_d8 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)0x113ec0);
      iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffdb0,(size_t *)in_stack_fffffffffffffda8,0);
      local_e0 = (long)iVar2;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdb0,
                 (value_type_conflict2 *)in_stack_fffffffffffffda8);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffdb0);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x113e95);
    bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      (in_stack_fffffffffffffdc0);
    if (bVar1) {
      local_e8 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdb0,
                 (value_type_conflict2 *)in_stack_fffffffffffffda8);
    }
    local_f0 = &local_88;
    local_f8._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffffda8);
    local_100 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffda8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffdb0,
                              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffda8), bVar1) {
      local_108 = __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*(&local_f8);
      (**(code **)(*(long *)pDVar3 + 0x1f8))(in_XMM0_Da,pDVar3,local_48,*local_108);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_f8);
    }
    local_110 = 0;
    uVar4 = std::__cxx11::string::empty();
    iVar2 = local_48;
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::string(local_130,in_RSI);
      pDVar9 = pDVar3;
    }
    else {
      pDVar9 = pDVar3;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::front
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffdb0);
      (**(code **)(*(long *)pDVar3 + 0x58))(local_130,pDVar3,iVar2,*pvVar5,&local_110);
    }
    local_138 = SoapySDR::formatToSize(local_130);
    iVar2 = local_48;
    local_158 = 0;
    uStack_150 = 0;
    local_168 = 0;
    uStack_160 = 0;
    local_178 = 0;
    uStack_170 = 0;
    pDVar3 = pDVar9;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x114134);
    pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             (**(code **)(*(long *)pDVar9 + 0x68))(pDVar9,iVar2,local_130,&local_88,&local_178);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x11417b);
    local_140 = pvVar6;
    poVar7 = std::operator<<((ostream *)&std::cout,"Stream format: ");
    poVar7 = std::operator<<(poVar7,local_130);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)&std::cout,"Num channels: ");
    sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_88);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar8);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)&std::cout,"Element size: ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_138);
    poVar7 = std::operator<<(poVar7," bytes");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)&std::cout,"Begin ");
    poVar7 = std::operator<<(poVar7,in_RCX);
    iVar2 = (int)((ulong)in_RCX >> 0x20);
    poVar7 = std::operator<<(poVar7," rate test at ");
    poVar7 = (ostream *)
             std::ostream::operator<<(poVar7,(double)CONCAT44(in_XMM0_Db,in_XMM0_Da) / 1000000.0);
    poVar7 = std::operator<<(poVar7," Msps");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    pvVar6 = local_140;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_88);
    runRateTestStreamLoop((Device *)in_RSI,in_RDX,iVar2,(size_t)pDVar3,in_stack_ffffffffffffffc0);
    (**(code **)(*(long *)pDVar3 + 0x70))(pDVar3,local_140);
    SoapySDR::Device::unmake(pDVar3);
    std::__cxx11::string::~string(local_130);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(pvVar6);
    return 1;
  }
  local_69 = 1;
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  std::invalid_argument::invalid_argument(this,local_68);
  local_69 = 0;
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int SoapySDRRateTest(
    const std::string &argStr,
    const double sampleRate,
    const std::string &formatStr,
    const std::string &channelStr,
    const std::string &directionStr)
{
    SoapySDR::Device *device(nullptr);

    try
    {
        device = SoapySDR::Device::make(argStr);

        //parse the direction to the integer enum
        int direction(-1);
        if (directionStr == "RX" or directionStr == "rx") direction = SOAPY_SDR_RX;
        if (directionStr == "TX" or directionStr == "tx") direction = SOAPY_SDR_TX;
        if (direction == -1) throw std::invalid_argument("direction not in RX/TX: " + directionStr);

        //build channels list, using KwargsFromString is a easy parsing hack
        std::vector<size_t> channels;
        for (const auto &pair : SoapySDR::KwargsFromString(channelStr))
        {
            channels.push_back(std::stoi(pair.first));
        }
        if (channels.empty()) channels.push_back(0);

        //initialize the sample rate for all channels
        for (const auto &chan : channels)
        {
            device->setSampleRate(direction, chan, sampleRate);
        }

        //create the stream, use the native format
        double fullScale(0.0);
        const auto format = formatStr.empty() ? device->getNativeStreamFormat(direction, channels.front(), fullScale) : formatStr;
        const size_t elemSize = SoapySDR::formatToSize(format);
        auto stream = device->setupStream(direction, format, channels);

        //run the rate test one setup is complete
        std::cout << "Stream format: " << format << std::endl;
        std::cout << "Num channels: " << channels.size() << std::endl;
        std::cout << "Element size: " << elemSize << " bytes" << std::endl;
        std::cout << "Begin " << directionStr << " rate test at " << (sampleRate/1e6) << " Msps" << std::endl;
        runRateTestStreamLoop(device, stream, direction, channels.size(), elemSize);

        //cleanup stream and device
        device->closeStream(stream);
        SoapySDR::Device::unmake(device);
    }
    catch (const std::exception &ex)
    {
        std::cerr << "Error in rate test: " << ex.what() << std::endl;
        SoapySDR::Device::unmake(device);
        return EXIT_FAILURE;
    }
    return EXIT_FAILURE;
}